

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Symbol finish_symop(Env *env,Symbol s)

{
  _Bool _Var1;
  uint32_t start;
  uint res;
  uint32_t after_symop;
  Symbol s_local;
  Env *env_local;
  
  _Var1 = valid(env,s);
  if ((_Var1) || (_Var1 = valid(env,LEFT_SECTION_OP), _Var1)) {
    start = symop_lookahead(env);
    env_local._4_4_ = left_section_op(env,start);
    if (env_local._4_4_ == FAIL) {
      (*env->lexer->mark_end)(env->lexer);
      env_local._4_4_ = s;
    }
  }
  else {
    env_local._4_4_ = FAIL;
  }
  return env_local._4_4_;
}

Assistant:

static Symbol finish_symop(Env *env, Symbol s) {
  if (valid(env, s) || valid(env, LEFT_SECTION_OP)) {
    uint32_t after_symop = symop_lookahead(env);
    SEQ(left_section_op(env, after_symop));
    MARK("symop");
    return s;
  }
  return FAIL;
}